

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

int Prs_ManReadLines(Prs_Man_t *p)

{
  int iVar1;
  Prs_Man_t *p_local;
  
  while( true ) {
    if (p->pCur[1] == '\0') {
      return 0;
    }
    iVar1 = Prs_ManIsChar(p,'\n');
    if (iVar1 == 0) break;
    Prs_ManSkip(p);
    Prs_ManSkipSpaces(p);
    iVar1 = Prs_ManIsChar(p,'\n');
    if ((iVar1 == 0) && (iVar1 = Prs_ManReadDirective(p), iVar1 != 0)) {
      return 1;
    }
  }
  __assert_fail("Prs_ManIsChar(p, \'\\n\')",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                ,0x180,"int Prs_ManReadLines(Prs_Man_t *)");
}

Assistant:

static inline int Prs_ManReadLines( Prs_Man_t * p )
{
    while ( p->pCur[1] != '\0' )
    {
        assert( Prs_ManIsChar(p, '\n') );
        Prs_ManSkip(p);
        Prs_ManSkipSpaces( p );
        if ( Prs_ManIsChar(p, '\n') )
            continue;
        if ( Prs_ManReadDirective(p) )   
            return 1;
    }
    return 0;
}